

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNRefitT<4,_embree::UserGeometry,_embree::Object>::build
          (BVHNRefitT<4,_embree::UserGeometry,_embree::Object> *this)

{
  uint uVar1;
  
  uVar1 = (this->mesh->super_AccelSet).super_Geometry.numPrimitives;
  if (uVar1 == this->topologyVersion) {
    BVHNRefitter<4>::refit
              ((this->refitter)._M_t.
               super___uniq_ptr_impl<embree::sse2::BVHNRefitter<4>,_std::default_delete<embree::sse2::BVHNRefitter<4>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::sse2::BVHNRefitter<4>_*,_std::default_delete<embree::sse2::BVHNRefitter<4>_>_>
               .super__Head_base<0UL,_embree::sse2::BVHNRefitter<4>_*,_false>._M_head_impl);
    return;
  }
  this->topologyVersion = uVar1;
  (**(code **)((long)(((this->builder)._M_t.
                       super___uniq_ptr_impl<embree::Builder,_std::default_delete<embree::Builder>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::Builder_*,_std::default_delete<embree::Builder>_>
                       .super__Head_base<0UL,_embree::Builder_*,_false>._M_head_impl)->
                     super_RefCount)._vptr_RefCount + 0x20))();
  return;
}

Assistant:

void BVHNRefitT<N,Mesh,Primitive>::build()
    {
      if (mesh->topologyChanged(topologyVersion)) {
        topologyVersion = mesh->getTopologyVersion();
        builder->build();
      }
      else
        refitter->refit();
    }